

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O3

uint8_t * __thiscall ProtocolARP::Protocol2Hardware(ProtocolARP *this,uint8_t *protocolAddress)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8_t *puVar3;
  
  bVar1 = IsBroadcast(this,protocolAddress);
  if (bVar1) {
    iVar2 = (*this->MAC->_vptr_InterfaceMAC[6])();
    return (uint8_t *)CONCAT44(extraout_var,iVar2);
  }
  bVar1 = IsLocal(this,protocolAddress);
  if (!bVar1) {
    protocolAddress = ProtocolIPv4::GetGatewayAddress(this->IP);
  }
  iVar2 = LocateProtocolAddress(this,protocolAddress);
  if (iVar2 == -1) {
    SendRequest(this,protocolAddress);
    puVar3 = (uint8_t *)0x0;
  }
  else {
    puVar3 = this->Cache[iVar2].MACAddress;
  }
  return puVar3;
}

Assistant:

const uint8_t* ProtocolARP::Protocol2Hardware(const uint8_t* protocolAddress)
{
    int index;
    const uint8_t* rc = nullptr;

    if (IsBroadcast(protocolAddress))
    {
        rc = MAC.GetBroadcastAddress();
    }
    else
    {
        if (!IsLocal(protocolAddress))
        {
            protocolAddress = IP.GetGatewayAddress();
        }
        index = LocateProtocolAddress(protocolAddress);

        if (index != -1)
        {
            rc = Cache[index].MACAddress;
        }
        else
        {
            SendRequest(protocolAddress);
        }
    }
    return rc;
}